

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O0

void __thiscall QColorDialogPrivate::initHelper(QColorDialogPrivate *this,QPlatformDialogHelper *h)

{
  QColorDialog *slot;
  QSharedPointer *in_RSI;
  QColorDialogPrivate *in_RDI;
  long in_FS_OFFSET;
  ConnectionType unaff_retaddr;
  QPlatformColorDialogHelper *colorDialogHelper;
  QColorDialog *d;
  QSharedPointer *context;
  Connection local_28;
  code *signal;
  Connection local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  slot = q_func(in_RDI);
  signal = QColorDialog::currentColorChanged;
  context = in_RSI;
  QObject::
  connect<void(QPlatformColorDialogHelper::*)(QColor_const&),void(QColorDialog::*)(QColor_const&)>
            ((Object *)in_RDI,
             (offset_in_QPlatformColorDialogHelper_to_subr)QColorDialog::currentColorChanged,
             (ContextType *)in_RSI,(offset_in_QColorDialog_to_subr *)slot,unaff_retaddr);
  QMetaObject::Connection::~Connection(&local_10);
  QObject::
  connect<void(QPlatformColorDialogHelper::*)(QColor_const&),void(QColorDialog::*)(QColor_const&)>
            ((Object *)in_RDI,(offset_in_QPlatformColorDialogHelper_to_subr)signal,
             (ContextType *)context,(offset_in_QColorDialog_to_subr *)slot,unaff_retaddr);
  QMetaObject::Connection::~Connection(&local_28);
  QPlatformColorDialogHelper::setOptions(in_RSI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColorDialogPrivate::initHelper(QPlatformDialogHelper *h)
{
    QColorDialog *d = q_func();
    auto *colorDialogHelper = static_cast<QPlatformColorDialogHelper*>(h);
    QObject::connect(colorDialogHelper, &QPlatformColorDialogHelper::currentColorChanged,
                     d, &QColorDialog::currentColorChanged);
    QObject::connect(colorDialogHelper, &QPlatformColorDialogHelper::colorSelected,
                     d, &QColorDialog::colorSelected);
    colorDialogHelper->setOptions(options);
}